

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManPlaceDfs_rec(Frc_Man_t *p,Frc_Obj_t *pObj,int *piPlace)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_2c;
  Frc_Obj_t *pFStack_28;
  int i;
  Frc_Obj_t *pFanin;
  int *piPlace_local;
  Frc_Obj_t *pObj_local;
  Frc_Man_t *p_local;
  
  if (pObj->iFanout == 0) {
    __assert_fail("pObj->iFanout > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                  ,800,"void Frc_ManPlaceDfs_rec(Frc_Man_t *, Frc_Obj_t *, int *)");
  }
  uVar1 = pObj->iFanout;
  pObj->iFanout = uVar1 - 1;
  if (uVar1 == pObj->nFanouts) {
    iVar2 = Frc_ObjIsCi(pObj);
    if (iVar2 == 0) {
      local_2c = 0;
      while( true ) {
        bVar3 = false;
        if (local_2c < (int)(*(uint *)pObj >> 4)) {
          pFStack_28 = Frc_ObjFanin(pObj,local_2c);
          bVar3 = pFStack_28 != (Frc_Obj_t *)0x0;
        }
        if (!bVar3) break;
        Frc_ManPlaceDfs_rec(p,pFStack_28,piPlace);
        local_2c = local_2c + 1;
      }
    }
    iVar2 = *piPlace;
    *piPlace = iVar2 + 1;
    pObj->pPlace = iVar2;
  }
  return;
}

Assistant:

void Frc_ManPlaceDfs_rec( Frc_Man_t * p, Frc_Obj_t * pObj, int * piPlace )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFanin( pObj, pFanin, i )
                Frc_ManPlaceDfs_rec( p, pFanin, piPlace );
        pObj->pPlace = (*piPlace)++;
    }
}